

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void selectWindowRewriteEList
               (Parse *pParse,Window *pWin,SrcList *pSrc,ExprList *pEList,ExprList **ppSub)

{
  Window *local_60;
  SrcList *local_58;
  ExprList *local_50;
  undefined8 local_48;
  Walker local_40;
  
  local_40.u.pNC = (NameContext *)&local_60;
  local_48 = 0;
  local_40.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_40.walkerDepth = 0;
  local_40.eCode = '\0';
  local_40._37_3_ = 0;
  local_50 = *ppSub;
  local_40.xExprCallback = selectWindowRewriteExprCb;
  local_40.xSelectCallback = selectWindowRewriteSelectCb;
  local_60 = pWin;
  local_58 = pSrc;
  local_40.pParse = pParse;
  sqlite3WalkExprList(&local_40,pEList);
  *ppSub = local_50;
  return;
}

Assistant:

static void selectWindowRewriteEList(
  Parse *pParse, 
  Window *pWin,
  SrcList *pSrc,
  ExprList *pEList,               /* Rewrite expressions in this list */
  ExprList **ppSub                /* IN/OUT: Sub-select expression-list */
){
  Walker sWalker;
  WindowRewrite sRewrite;

  memset(&sWalker, 0, sizeof(Walker));
  memset(&sRewrite, 0, sizeof(WindowRewrite));

  sRewrite.pSub = *ppSub;
  sRewrite.pWin = pWin;
  sRewrite.pSrc = pSrc;

  sWalker.pParse = pParse;
  sWalker.xExprCallback = selectWindowRewriteExprCb;
  sWalker.xSelectCallback = selectWindowRewriteSelectCb;
  sWalker.u.pRewrite = &sRewrite;

  (void)sqlite3WalkExprList(&sWalker, pEList);

  *ppSub = sRewrite.pSub;
}